

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O0

float deqp::gls::anon_unknown_0::getWellBehavingChannelColor(float v,int numBits)

{
  uint uVar1;
  ulong uVar2;
  float local_84;
  ulong local_80;
  ulong local_78;
  deUint64 tweakedValue;
  deUint64 tweakedSubUnits;
  deUint64 subUnits;
  deUint64 units;
  deUint64 fixedValue;
  deUint64 maxFixedValue;
  deUint64 subUnitBorderHi;
  deUint64 subUnitBorderLo;
  deUint64 numSubBits;
  int numBits_local;
  float v_local;
  
  numBits_local = (int)v;
  if (((numBits != 0) && (0.0 < v)) && (v < 1.0)) {
    numSubBits._4_1_ = (char)numBits;
    uVar1 = (1 << (numSubBits._4_1_ + 3U & 0x1f)) - 1;
    uVar2 = deRoundFloatToInt64(v * (float)uVar1);
    local_80 = uVar2 & 7;
    if (local_80 == 3) {
      local_78 = 2;
    }
    else {
      if (local_80 == 4) {
        local_80 = 5;
      }
      local_78 = local_80;
    }
    local_84 = (float)(uVar2 & 0xfffffffffffffff8 | local_78);
    numBits_local = (int)(local_84 / (float)uVar1);
  }
  return (float)numBits_local;
}

Assistant:

static float getWellBehavingChannelColor (float v, int numBits)
{
	DE_ASSERT(de::inRange(numBits, 0, 32));

	// clear color may not be accurately representable in the target format. If the clear color is
	// on a representable value mapping range border, it could be rounded differently by the GL and in
	// SGLR adding an unexpected error source. However, selecting an accurately representable background
	// color would effectively disable dithering. To allow dithering and to prevent undefined rounding
	// direction from affecting results, round accurate color to target color format with 8 sub-units
	// (3 bits). If the selected sub-unit value is 3 or 4 (bordering 0.5), replace it with 2 and 5,
	// respectively.

	if (numBits == 0 || v <= 0.0f || v >= 1.0f)
	{
		// already accurately representable
		return v;
	}
	else
	{
		const deUint64 numSubBits		= 3;
		const deUint64 subUnitBorderLo	= (1u << (numSubBits - 1u)) - 1u;
		const deUint64 subUnitBorderHi	= 1u << (numSubBits - 1u);
		const deUint64 maxFixedValue	= (1u << (numBits + numSubBits)) - 1u;
		const deUint64 fixedValue		= deRoundFloatToInt64(v * (float)maxFixedValue);

		const deUint64 units			= fixedValue >> numSubBits;
		const deUint64 subUnits			= fixedValue & ((1u << numSubBits) - 1u);

		const deUint64 tweakedSubUnits	= (subUnits == subUnitBorderLo) ? (subUnitBorderLo - 1)
										: (subUnits == subUnitBorderHi) ? (subUnitBorderHi + 1)
										: (subUnits);
		const deUint64 tweakedValue		= (units << numSubBits) | (tweakedSubUnits);

		return float(tweakedValue) / float(maxFixedValue);
	}
}